

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCut.c
# Opt level: O0

Map_Cut_t * Map_CutSortCuts(Map_Man_t *pMan,Map_CutTable_t *p,Map_Cut_t *pList)

{
  Map_Cut_t *pMVar1;
  int local_30;
  int local_2c;
  int i;
  int nCuts;
  Map_Cut_t *pListNew;
  Map_Cut_t *pList_local;
  Map_CutTable_t *p_local;
  Map_Man_t *pMan_local;
  
  local_2c = Map_CutList2Array(p->pCuts1,pList);
  if (local_2c < 0x3e9) {
    qsort(p->pCuts1,(long)local_2c,8,Map_CutSortCutsCompare);
    if (0xf9 < local_2c) {
      for (local_30 = 0xf9; local_30 < local_2c; local_30 = local_30 + 1) {
        Extra_MmFixedEntryRecycle(pMan->mmCuts,(char *)p->pCuts1[local_30]);
      }
      local_2c = 0xf9;
    }
    pMVar1 = Map_CutArray2List(p->pCuts1,local_2c);
    return pMVar1;
  }
  __assert_fail("nCuts <= MAP_CUTS_MAX_COMPUTE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCut.c"
                ,0x3ef,"Map_Cut_t *Map_CutSortCuts(Map_Man_t *, Map_CutTable_t *, Map_Cut_t *)");
}

Assistant:

Map_Cut_t * Map_CutSortCuts( Map_Man_t * pMan, Map_CutTable_t * p, Map_Cut_t * pList )
{
    Map_Cut_t * pListNew;
    int nCuts, i;
//    abctime clk;
    // move the cuts from the list into the array
    nCuts = Map_CutList2Array( p->pCuts1, pList );
    assert( nCuts <= MAP_CUTS_MAX_COMPUTE );
    // sort the cuts
//clk = Abc_Clock();
    qsort( (void *)p->pCuts1, (size_t)nCuts, sizeof(Map_Cut_t *), 
            (int (*)(const void *, const void *)) Map_CutSortCutsCompare );
//pMan->time2 += Abc_Clock() - clk;
    // move them back into the list
    if ( nCuts > MAP_CUTS_MAX_USE - 1 )
    {
        // free the remaining cuts
        for ( i = MAP_CUTS_MAX_USE - 1; i < nCuts; i++ )
            Extra_MmFixedEntryRecycle( pMan->mmCuts, (char *)p->pCuts1[i] );
        // update the number of cuts
        nCuts = MAP_CUTS_MAX_USE - 1;
    }
    pListNew = Map_CutArray2List( p->pCuts1, nCuts );
    return pListNew;
}